

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration absl::lts_20250127::Ceil(Duration d,Duration unit)

{
  bool bVar1;
  undefined8 extraout_RDX;
  Duration DVar2;
  Duration DVar3;
  undefined8 local_160;
  undefined4 local_158;
  undefined8 local_a8;
  undefined4 local_a0;
  Duration td;
  Duration unit_local;
  Duration d_local;
  undefined4 local_c;
  
  DVar2 = Trunc(d,unit);
  local_a8 = DVar2.rep_hi_;
  local_a0 = DVar2.rep_lo_;
  bVar1 = operator>=(DVar2,d);
  if (bVar1) {
    d_local.rep_hi_.hi_ = (uint32_t)local_a8;
    d_local.rep_lo_ = local_a8._4_4_;
    local_c = local_a0;
  }
  else {
    DVar3.rep_hi_.hi_ = 0;
    DVar3.rep_hi_.lo_ = unit.rep_lo_;
    DVar3.rep_lo_ = (uint32_t)extraout_RDX;
    DVar3 = AbsDuration((lts_20250127 *)unit.rep_hi_,DVar3);
    DVar2 = operator+(DVar2,DVar3);
    local_160 = DVar2.rep_hi_;
    d_local.rep_hi_.hi_ = (uint32_t)local_160;
    d_local.rep_lo_ = local_160._4_4_;
    local_158 = DVar2.rep_lo_;
    local_c = local_158;
  }
  DVar2.rep_lo_ = local_c;
  DVar2.rep_hi_.lo_ = d_local.rep_hi_.hi_;
  DVar2.rep_hi_.hi_ = d_local.rep_lo_;
  return DVar2;
}

Assistant:

Duration Ceil(const Duration d, const Duration unit) {
  const absl::Duration td = Trunc(d, unit);
  return td >= d ? td : td + AbsDuration(unit);
}